

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTDMT_freeCCtxPool(ZSTDMT_CCtxPool *pool)

{
  ZSTD_freeFunction UNRECOVERED_JUMPTABLE;
  long lVar1;
  
  if (0 < pool->totalCCtx) {
    lVar1 = 0;
    do {
      ZSTD_freeCCtx(pool->cctx[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < pool->totalCCtx);
  }
  pthread_mutex_destroy((pthread_mutex_t *)pool);
  UNRECOVERED_JUMPTABLE = (pool->cMem).customFree;
  if (UNRECOVERED_JUMPTABLE != (ZSTD_freeFunction)0x0) {
    (*UNRECOVERED_JUMPTABLE)((pool->cMem).opaque,pool);
    return;
  }
  free(pool);
  return;
}

Assistant:

static void ZSTDMT_freeCCtxPool(ZSTDMT_CCtxPool* pool)
{
    int cid;
    for (cid=0; cid<pool->totalCCtx; cid++)
        ZSTD_freeCCtx(pool->cctx[cid]);  /* note : compatible with free on NULL */
    ZSTD_pthread_mutex_destroy(&pool->poolMutex);
    ZSTD_customFree(pool, pool->cMem);
}